

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall
Catch::MultiReporter::assertionEnded(MultiReporter *this,AssertionStats *assertionStats)

{
  pointer puVar1;
  IEventListener *pIVar2;
  int iVar3;
  char cVar4;
  pointer puVar5;
  
  cVar4 = '\x01';
  if ((assertionStats->assertionResult).m_resultData.resultType == Ok) {
    iVar3 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[4])();
    cVar4 = (char)iVar3;
  }
  puVar5 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar1) {
      return;
    }
    pIVar2 = puVar5->m_ptr;
    if (cVar4 == '\0') {
      if (pIVar2 == (IEventListener *)0x0) goto LAB_0013f034;
      if ((pIVar2->m_preferences).shouldReportAllAssertions != false) goto LAB_0013f01a;
    }
    else {
      if (pIVar2 == (IEventListener *)0x0) {
LAB_0013f034:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                      ,0x385,
                      "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
                     );
      }
LAB_0013f01a:
      (*pIVar2->_vptr_IEventListener[0xd])(pIVar2,assertionStats);
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void MultiReporter::assertionEnded( AssertionStats const& assertionStats ) {
        const bool reportByDefault =
            assertionStats.assertionResult.getResultType() != ResultWas::Ok ||
            m_config->includeSuccessfulResults();

        for ( auto & reporterish : m_reporterLikes ) {
            if ( reportByDefault ||
                 reporterish->getPreferences().shouldReportAllAssertions ) {
                    reporterish->assertionEnded( assertionStats );
            }
        }
    }